

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralNormalFilteringForMeshDenoising.cpp
# Opt level: O1

void __thiscall
BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme
          (BilateralNormalFilteringForMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *ppvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ParameterSet *pPVar6;
  pointer pVVar7;
  bool bVar8;
  size_type __new_size;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  FaceIter FVar21;
  undefined1 auStack_178 [8];
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  double multiple_sigma_c;
  double sigma_s;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  undefined1 auStack_f8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  undefined1 auStack_d8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  undefined1 local_98 [8];
  FaceIter f_it;
  int face_neighbor_index;
  undefined1 auStack_58 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  int local_34 [2];
  int normal_iteration_number;
  
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,__new_size);
  pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
  ppvVar1 = &all_face_neighbor.
             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  auStack_58 = (undefined1  [8])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"Face Neighbor","");
  bVar8 = ParameterSet::getValue(pPVar6,(string *)auStack_58,(int *)&f_it.skip_bits_);
  if (auStack_58 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)auStack_58);
  }
  if (bVar8) {
    pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
    auStack_58 = (undefined1  [8])ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"Multiple(* sigma_c)","");
    bVar8 = ParameterSet::getValue
                      (pPVar6,(string *)auStack_58,
                       (double *)
                       &face_neighbor.
                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (auStack_58 != (undefined1  [8])ppvVar1) {
      operator_delete((void *)auStack_58);
    }
    if (bVar8) {
      pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
      auStack_58 = (undefined1  [8])ppvVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_58,"Normal Iteration Num.","");
      bVar8 = ParameterSet::getValue(pPVar6,(string *)auStack_58,local_34);
      if (auStack_58 != (undefined1  [8])ppvVar1) {
        operator_delete((void *)auStack_58);
      }
      if (bVar8) {
        pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
        auStack_58 = (undefined1  [8])ppvVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"sigma_s","");
        bVar8 = ParameterSet::getValue(pPVar6,(string *)auStack_58,&multiple_sigma_c);
        if (auStack_58 != (undefined1  [8])ppvVar1) {
          operator_delete((void *)auStack_58);
        }
        if (bVar8) {
          auStack_58 = (undefined1  [8])0x0;
          all_face_neighbor.
          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          all_face_neighbor.
          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getAllFaceNeighbor
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                      *)auStack_58,(uint)(f_it.skip_bits_ != 0),false);
          auStack_f8 = (undefined1  [8])0x0;
          previous_normals.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          previous_normals.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceNormal
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_f8);
          auStack_178 = (undefined1  [8])0x0;
          face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceArea
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<double,_std::allocator<double>_> *)auStack_178);
          auStack_d8 = (undefined1  [8])0x0;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceCentroid
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_d8);
          dVar13 = getSigmaC(this,mesh,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)auStack_d8,
                             (double)face_neighbor.
                                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (0 < local_34[0]) {
            iVar11 = 0;
            do {
              _local_98 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
              while( true ) {
                FVar21 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
                if (f_it.mesh_._0_4_ == (BaseHandle)FVar21.hnd_.super_BaseHandle.idx_ &&
                    local_98 == (undefined1  [8])FVar21.mesh_) break;
                lVar10 = (long)(int)f_it.mesh_._0_4_;
                local_128 = (((pointer)((long)auStack_f8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[0];
                local_120 = (((pointer)((long)auStack_f8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[1];
                local_118 = (((pointer)((long)auStack_f8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[2];
                local_110 = (((pointer)((long)auStack_d8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[0];
                local_108 = (((pointer)((long)auStack_d8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[1];
                local_100 = (((pointer)((long)auStack_d8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[2];
                std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                          ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                           &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                           ((long)auStack_58 + lVar10 * 0x18));
                uVar9 = (uint)((ulong)((long)face_neighbor.
                                             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      (long)face_area.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage) >> 2)
                ;
                if ((int)uVar9 < 1) {
                  dVar14 = 0.0;
                  dVar20 = 0.0;
                  dVar19 = 0.0;
                  dVar18 = 0.0;
                }
                else {
                  dVar18 = 0.0;
                  uVar12 = 0;
                  dVar19 = 0.0;
                  dVar20 = 0.0;
                  dVar14 = 0.0;
                  do {
                    iVar5 = *(int *)((long)face_area.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage +
                                    uVar12 * 4);
                    dVar16 = local_110 -
                             (((pointer)((long)auStack_d8 + (long)iVar5 * 0x18))->
                             super_VectorDataT<double,_3>).values_[0];
                    dVar17 = local_108 -
                             (((pointer)((long)auStack_d8 + (long)iVar5 * 0x18))->
                             super_VectorDataT<double,_3>).values_[1];
                    dVar15 = local_100 -
                             (((pointer)((long)auStack_d8 + (long)iVar5 * 0x18))->
                             super_VectorDataT<double,_3>).values_[2];
                    dVar2 = (((pointer)((long)auStack_f8 + (long)iVar5 * 0x18))->
                            super_VectorDataT<double,_3>).values_[0];
                    dVar3 = (((pointer)((long)auStack_f8 + (long)iVar5 * 0x18))->
                            super_VectorDataT<double,_3>).values_[1];
                    dVar4 = (((pointer)((long)auStack_f8 + (long)iVar5 * 0x18))->
                            super_VectorDataT<double,_3>).values_[2];
                    dVar15 = dVar15 * dVar15 + dVar16 * dVar16 + dVar17 * dVar17;
                    sigma_s = dVar14;
                    if (dVar15 < 0.0) {
                      dVar15 = sqrt(dVar15);
                    }
                    else {
                      dVar15 = SQRT(dVar15);
                    }
                    local_130 = exp((dVar15 * -0.5 * dVar15) / (dVar13 * dVar13));
                    dVar15 = local_128 - dVar2;
                    dVar16 = local_120 - dVar3;
                    dVar14 = local_118 - dVar4;
                    dVar14 = dVar14 * dVar14 + dVar15 * dVar15 + dVar16 * dVar16;
                    if (dVar14 < 0.0) {
                      dVar14 = sqrt(dVar14);
                    }
                    else {
                      dVar14 = SQRT(dVar14);
                    }
                    dVar15 = exp((dVar14 * -0.5 * dVar14) / (multiple_sigma_c * multiple_sigma_c));
                    dVar15 = local_130 * *(double *)((long)auStack_178 + (long)iVar5 * 8) * dVar15;
                    dVar14 = sigma_s + dVar15;
                    dVar20 = dVar20 + dVar2 * dVar15;
                    dVar19 = dVar19 + dVar3 * dVar15;
                    dVar18 = dVar18 + dVar4 * dVar15;
                    uVar12 = uVar12 + 1;
                  } while ((uVar9 & 0x7fffffff) != uVar12);
                }
                dVar20 = dVar20 / dVar14;
                dVar19 = dVar19 / dVar14;
                dVar18 = dVar18 / dVar14;
                dVar14 = dVar18 * dVar18 + dVar20 * dVar20 + dVar19 * dVar19;
                if (dVar14 < 0.0) {
                  dVar14 = sqrt(dVar14);
                }
                else {
                  dVar14 = SQRT(dVar14);
                }
                pVVar7 = (filtered_normals->
                         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pVVar7[lVar10].super_VectorDataT<double,_3>.values_[0] = dVar20 / dVar14;
                pVVar7[lVar10].super_VectorDataT<double,_3>.values_[1] = dVar19 / dVar14;
                pVVar7[lVar10].super_VectorDataT<double,_3>.values_[2] = dVar18 / dVar14;
                if (face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  operator_delete(face_area.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                f_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it.mesh_._0_4_ + 1);
                if (f_it.mesh_._4_4_ != 0) {
                  OpenMesh::Iterators::
                  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                              *)local_98);
                }
              }
              std::
              vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
              operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)auStack_f8,filtered_normals);
              iVar11 = iVar11 + 1;
            } while (iVar11 < local_34[0]);
          }
          if (auStack_d8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_d8);
          }
          if (auStack_178 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_178);
          }
          if (auStack_f8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_f8);
          }
          std::
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                     *)auStack_58);
        }
      }
    }
  }
  return;
}

Assistant:

void BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize(mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double multiple_sigma_c;
    if(!parameter_set_->getValue(string("Multiple(* sigma_c)"), multiple_sigma_c))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_s;
    if(!parameter_set_->getValue(string("sigma_s"), sigma_s))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, false);
    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_c = getSigmaC(mesh, face_centroid, multiple_sigma_c);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = previous_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];
            int size = (int)face_neighbor.size();
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            double weight_sum = 0.0;
            for(int i = 0; i < size; i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = previous_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];

                double spatial_distance = (ci - cj).length();
                double spatial_weight = std::exp( -0.5 * spatial_distance * spatial_distance / (sigma_c * sigma_c) );
                double range_distance = (ni - nj).length();
                double range_weight = std::exp( -0.5 * range_distance * range_distance / (sigma_s * sigma_s) );

                double weight = face_area[index_j] * spatial_weight * range_weight;
                weight_sum += weight;
                temp_normal += nj * weight;
            }
            temp_normal /= weight_sum;
            temp_normal.normalize();
            filtered_normals[index_i] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}